

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<const_ON_SubDEdge_*> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges,bool bIgnoreCorners)

{
  ON_SubDEdge *pOVar1;
  uint uVar2;
  uint i;
  ulong uVar3;
  ulong new_capacity;
  ON_SubDEdgePtr eptr;
  ON_SimpleArray<ON_SubDEdgePtr> unsorted_eptrs;
  ON_SubDEdgePtr local_58;
  ON_SimpleArray<ON_SubDEdgePtr> *local_50;
  ON_SimpleArray<ON_SubDEdgePtr> local_48;
  
  new_capacity = (ulong)(uint)unsorted_edges->m_count;
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00825d08;
  local_48.m_a = (ON_SubDEdgePtr *)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  local_50 = sorted_edges;
  if (new_capacity != 0) {
    ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(&local_48,new_capacity);
    uVar3 = 0;
    do {
      pOVar1 = unsorted_edges->m_a[uVar3];
      if (((pOVar1 != (ON_SubDEdge *)0x0) && (pOVar1->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
         (pOVar1->m_vertex[0] != pOVar1->m_vertex[1] && pOVar1->m_vertex[1] != (ON_SubDVertex *)0x0)
         ) {
        local_58.m_ptr = (ON__UINT_PTR)pOVar1;
        if ((pOVar1->m_face_count == 1) && ((pOVar1->m_face2[0].m_ptr & 1) == 0)) {
          local_58.m_ptr = (ulong)pOVar1 & 0xfffffffffffffff9 ^ 1;
        }
        ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_48,&local_58);
      }
      uVar3 = uVar3 + 1;
    } while (new_capacity != uVar3);
  }
  uVar2 = SortEdgesIntoEdgeChains(&local_48,minimum_chain_length,local_50,bIgnoreCorners);
  ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_48);
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< const ON_SubDEdge* >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges,
  const bool bIgnoreCorners
)
{
  const unsigned int unsorted_edge_count = unsorted_edges.Count();
  ON_SimpleArray< ON_SubDEdgePtr > unsorted_eptrs(unsorted_edge_count);
  for (unsigned i = 0; i < unsorted_edge_count; ++i)
  {
    const ON_SubDEdge* e = unsorted_edges[i];
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;
    ON_SubDEdgePtr eptr = ON_SubDEdgePtr::Create(e, 0);
    if (1 == e->m_face_count && 0 == ON_SUBD_FACE_DIRECTION(e->m_face2[0].m_ptr))
      eptr = eptr.Reversed();
    unsorted_eptrs.Append(eptr);
  }
  return ON_SubDEdgeChain::SortEdgesIntoEdgeChains(unsorted_eptrs, minimum_chain_length, sorted_edges, bIgnoreCorners);
}